

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void initialization_suite::init_one(void)

{
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  int local_8c;
  circular_view<int,_18446744073709551615UL> local_88;
  view_pointer local_68;
  undefined8 uStack_60;
  view_pointer local_58;
  undefined8 uStack_50;
  view_pointer local_48;
  undefined8 uStack_40;
  view_pointer local_38;
  undefined8 uStack_30;
  type local_28 [6];
  
  local_28[0] = 0xb;
  local_28[1] = 0x16;
  local_28[2] = 0x21;
  local_28[3] = 0x2c;
  local_88.member.cap = 4;
  local_88.member.size = 1;
  local_88.member.next = 1;
  local_8c = 0xb;
  __l._M_len = 1;
  __l._M_array = &local_8c;
  local_88.member.data = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l,&local_a9);
  uStack_30 = 1;
  first_end.current = 1;
  first_end.parent = &local_88;
  first_begin.current = 0;
  first_begin.parent = &local_88;
  local_38 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x91f,"void initialization_suite::init_one()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_88.member.cap = 4;
  local_88.member.size = 1;
  local_88.member.next = 2;
  local_8c = 0x16;
  __l_00._M_len = 1;
  __l_00._M_array = &local_8c;
  local_88.member.data = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_00,&local_a9);
  uStack_40 = 2;
  first_end_00.current = 2;
  first_end_00.parent = &local_88;
  first_begin_00.current = 1;
  first_begin_00.parent = &local_88;
  local_48 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x926,"void initialization_suite::init_one()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_88.member.cap = 4;
  local_88.member.size = 1;
  local_88.member.next = 3;
  local_8c = 0x21;
  __l_01._M_len = 1;
  __l_01._M_array = &local_8c;
  local_88.member.data = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_01,&local_a9);
  uStack_50 = 3;
  first_end_01.current = 3;
  first_end_01.parent = &local_88;
  first_begin_01.current = 2;
  first_begin_01.parent = &local_88;
  local_58 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x92d,"void initialization_suite::init_one()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_88.member.cap = 4;
  local_88.member.size = 1;
  local_88.member.next = 4;
  local_8c = 0x2c;
  __l_02._M_len = 1;
  __l_02._M_array = &local_8c;
  local_88.member.data = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_02,&local_a9);
  uStack_60 = 4;
  first_end_02.current = 4;
  first_end_02.parent = &local_88;
  first_begin_02.current = 3;
  first_begin_02.parent = &local_88;
  local_68 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x934,"void initialization_suite::init_one()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void init_one()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 1);

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 1);

        std::vector<int> expect = { 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 1);

        std::vector<int> expect = { 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 3), 1);

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}